

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

void uc_init_x86_64(uc_struct *uc)

{
  uc->reg_read = reg_read_x86_64;
  uc->reg_write = reg_write_x86_64;
  uc->reg_reset = reg_reset;
  uc->release = x86_release;
  uc->set_pc = x86_set_pc;
  uc->get_pc = x86_get_pc;
  uc->stop_interrupt = x86_stop_interrupt;
  uc->insn_hook_validate = x86_insn_hook_validate;
  uc->opcode_hook_invalidate = x86_opcode_hook_invalidate;
  uc->cpus_init = x86_cpus_init;
  uc->cpu_context_size = 0x1598;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init = tcg_exec_init_x86_64;
  uc->cpu_exec_init_all = cpu_exec_init_all_x86_64;
  uc->vm_start = vm_start_x86_64;
  uc->memory_map = memory_map_x86_64;
  uc->memory_map_ptr = memory_map_ptr_x86_64;
  uc->memory_unmap = memory_unmap_x86_64;
  uc->memory_moveout = memory_moveout_x86_64;
  uc->memory_movein = memory_movein_x86_64;
  uc->readonly_mem = memory_region_set_readonly_x86_64;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_x86_64;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_x86_64;
  uc->memory_map_io = memory_map_io_x86_64;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_x86_64;
  uc->memory_filter_subregions = memory_region_filter_subregions_x86_64;
  uc->memory_cow = memory_cow_x86_64;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = x86_release;
    uc->set_pc = x86_set_pc;
    uc->get_pc = x86_get_pc;
    uc->stop_interrupt = x86_stop_interrupt;
    uc->insn_hook_validate = x86_insn_hook_validate;
    uc->opcode_hook_invalidate = x86_opcode_hook_invalidate;
    uc->cpus_init = x86_cpus_init;
    uc->cpu_context_size = offsetof(CPUX86State, retaddr);
    uc_common_init(uc);
}